

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

void set_close_on_exec(int fd,mg_connection *conn,mg_context *ctx)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  uint in_ECX;
  char *func;
  undefined4 in_register_0000003c;
  mg_connection fc;
  mg_connection local_9f8;
  
  iVar1 = fcntl64(CONCAT44(in_register_0000003c,fd),2,1);
  if ((conn != (mg_connection *)0x0) && (iVar1 != 0)) {
    memset(&local_9f8,0,0x9e8);
    local_9f8.dom_ctx = (mg_domain_context *)&conn[0x40].last_throttle_time;
    local_9f8.phys_ctx = (mg_context *)conn;
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    mg_cry_internal_wrap
              (&local_9f8,(mg_context *)0x0,func,in_ECX,"%s: fcntl(F_SETFD FD_CLOEXEC) failed: %s",
               "set_close_on_exec",pcVar3);
  }
  return;
}

Assistant:

static void
set_close_on_exec(int fd,
                  const struct mg_connection *conn /* may be null */,
                  struct mg_context *ctx /* may be null */)
{
#if defined(__ZEPHYR__)
	(void)fd;
	(void)conn;
	(void)ctx;
#else
	if (fcntl(fd, F_SETFD, FD_CLOEXEC) != 0) {
		if (conn || ctx) {
			struct mg_connection fc;
			mg_cry_internal((conn ? conn : fake_connection(&fc, ctx)),
			                "%s: fcntl(F_SETFD FD_CLOEXEC) failed: %s",
			                __func__,
			                strerror(ERRNO));
		}
	}
#endif
}